

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.cxx
# Opt level: O2

bool cmBuildNameCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  string *name;
  string *psVar1;
  cmMakefile *this;
  bool bVar2;
  cmValue cVar3;
  string *this_00;
  string buildname;
  string RegExp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string compiler;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &buildname;
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (name == psVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compiler,"called with incorrect number of arguments",
               (allocator<char> *)&buildname);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    this_00 = &compiler;
  }
  else {
    this = status->Makefile;
    cVar3 = cmMakefile::GetDefinition(this,name);
    if (cVar3.Value != (string *)0x0) {
      cmsys::RegularExpression::RegularExpression((RegularExpression *)&compiler,"[()/]");
      std::__cxx11::string::string((string *)&buildname,(string *)cVar3.Value);
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)&compiler,buildname._M_dataplus._M_p);
      if (bVar2) {
        RegExp._M_dataplus._M_p._0_1_ = 0x2f;
        local_180._M_dataplus._M_p._0_1_ = 0x5f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )buildname._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
                   (char *)&local_180);
        RegExp._M_dataplus._M_p._0_1_ = 0x28;
        local_180._M_dataplus._M_p._0_1_ = 0x5f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )buildname._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
                   (char *)&local_180);
        RegExp._M_dataplus._M_p._0_1_ = 0x29;
        local_180._M_dataplus._M_p._0_1_ = 0x5f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )buildname._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
                   (char *)&local_180);
        cmMakefile::AddCacheDefinition
                  (this,(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,buildname._M_dataplus._M_p,
                   "Name of build.",STRING,false);
      }
      std::__cxx11::string::~string((string *)&buildname);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&compiler);
      goto LAB_00203f86;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buildname,"WinNT",(allocator<char> *)&compiler);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compiler,"UNIX",(allocator<char> *)&RegExp);
    cVar3 = cmMakefile::GetDefinition(this,&compiler);
    std::__cxx11::string::~string((string *)&compiler);
    if (cVar3.Value != (string *)0x0) {
      buildname._M_string_length = 0;
      *buildname._M_dataplus._M_p = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&compiler,"uname -a",(allocator<char> *)&RegExp);
      cmSystemTools::RunSingleCommand
                (&compiler,&buildname,&buildname,(int *)0x0,(char *)0x0,OUTPUT_MERGE,(cmDuration)0x0
                );
      std::__cxx11::string::~string((string *)&compiler);
      if (buildname._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&RegExp,"([^ ]*) [^ ]* ([^ ]*) ",(allocator<char> *)&compiler);
        cmsys::RegularExpression::RegularExpression((RegularExpression *)&compiler,&RegExp);
        bVar2 = cmsys::RegularExpression::find
                          ((RegularExpression *)&compiler,buildname._M_dataplus._M_p);
        if (bVar2) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_70,(RegularExpressionMatch *)&compiler,1);
          std::operator+(&local_50,&local_70,"-");
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_90,(RegularExpressionMatch *)&compiler,2);
          std::operator+(&local_180,&local_50,&local_90);
          std::__cxx11::string::operator=((string *)&buildname,(string *)&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
        }
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)&compiler);
        std::__cxx11::string::~string((string *)&RegExp);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compiler,"${CMAKE_CXX_COMPILER}",(allocator<char> *)&RegExp);
    cmMakefile::ExpandVariablesInString(this,&compiler);
    std::__cxx11::string::append((char *)&buildname);
    cmsys::SystemTools::GetFilenameName(&RegExp,&compiler);
    std::__cxx11::string::append((string *)&buildname);
    std::__cxx11::string::~string((string *)&RegExp);
    RegExp._M_dataplus._M_p._0_1_ = 0x2f;
    local_180._M_dataplus._M_p._0_1_ = 0x5f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )buildname._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
               (char *)&local_180);
    RegExp._M_dataplus._M_p._0_1_ = 0x28;
    local_180._M_dataplus._M_p._0_1_ = 0x5f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )buildname._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
               (char *)&local_180);
    RegExp._M_dataplus._M_p._0_1_ = 0x29;
    local_180._M_dataplus._M_p._0_1_ = 0x5f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )buildname._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
               (char *)&local_180);
    cmMakefile::AddCacheDefinition
              (this,(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,buildname._M_dataplus._M_p,
               "Name of build.",STRING,false);
    std::__cxx11::string::~string((string *)&compiler);
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00203f86:
  return name != psVar1;
}

Assistant:

bool cmBuildNameCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  cmMakefile& mf = status.GetMakefile();
  cmValue cacheValue = mf.GetDefinition(args[0]);
  if (cacheValue) {
    // do we need to correct the value?
    cmsys::RegularExpression reg("[()/]");
    std::string cv = *cacheValue;
    if (reg.find(cv)) {
      std::replace(cv.begin(), cv.end(), '/', '_');
      std::replace(cv.begin(), cv.end(), '(', '_');
      std::replace(cv.begin(), cv.end(), ')', '_');
      mf.AddCacheDefinition(args[0], cv, "Name of build.",
                            cmStateEnums::STRING);
    }
    return true;
  }

  std::string buildname = "WinNT";
  if (mf.GetDefinition("UNIX")) {
    buildname.clear();
    cmSystemTools::RunSingleCommand("uname -a", &buildname, &buildname);
    if (!buildname.empty()) {
      std::string RegExp = "([^ ]*) [^ ]* ([^ ]*) ";
      cmsys::RegularExpression reg(RegExp);
      if (reg.find(buildname)) {
        buildname = reg.match(1) + "-" + reg.match(2);
      }
    }
  }
  std::string compiler = "${CMAKE_CXX_COMPILER}";
  mf.ExpandVariablesInString(compiler);
  buildname += "-";
  buildname += cmSystemTools::GetFilenameName(compiler);
  std::replace(buildname.begin(), buildname.end(), '/', '_');
  std::replace(buildname.begin(), buildname.end(), '(', '_');
  std::replace(buildname.begin(), buildname.end(), ')', '_');

  mf.AddCacheDefinition(args[0], buildname, "Name of build.",
                        cmStateEnums::STRING);
  return true;
}